

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     UnaryUpdateLoop<duckdb::StringAggState,duckdb::string_t,duckdb::StringAggFunction>
               (string_t *idata,AggregateInputData *aggr_input_data,StringAggState *state,
               idx_t count,ValidityMask *mask,SelectionVector *sel_vector)

{
  bool bVar1;
  string_t *psVar2;
  ulong in_RCX;
  AggregateInputData *in_RSI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  StringAggState *in_R9;
  idx_t i_1;
  idx_t i;
  AggregateUnaryInput input;
  ulong local_58;
  ulong idx;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb8;
  AggregateUnaryInput *in_stack_ffffffffffffffc0;
  
  AggregateUnaryInput::AggregateUnaryInput
            ((AggregateUnaryInput *)&stack0xffffffffffffffb8,in_RSI,(ValidityMask *)in_R8);
  bVar1 = StringAggFunction::IgnoreNull();
  if ((!bVar1) || (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_R8), bVar1)) {
    for (local_58 = 0; local_58 < in_RCX; local_58 = local_58 + 1) {
      psVar2 = (string_t *)SelectionVector::get_index((SelectionVector *)in_R9,local_58);
      StringAggFunction::
      Operation<duckdb::string_t,duckdb::StringAggState,duckdb::StringAggFunction>
                (in_R9,psVar2,in_stack_ffffffffffffffc0);
    }
  }
  else {
    for (idx = 0; idx < in_RCX; idx = idx + 1) {
      psVar2 = (string_t *)SelectionVector::get_index((SelectionVector *)in_R9,idx);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(in_stack_ffffffffffffffb8,idx);
      if (bVar1) {
        StringAggFunction::
        Operation<duckdb::string_t,duckdb::StringAggState,duckdb::StringAggFunction>
                  (in_R9,psVar2,in_stack_ffffffffffffffc0);
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                   STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask,
	                                   const SelectionVector &__restrict sel_vector) {
		AggregateUnaryInput input(aggr_input_data, mask);
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
			}
		}
	}